

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

long ov_bitrate_instant(OggVorbis_File *vf)

{
  int local_2c;
  long ret;
  int link;
  OggVorbis_File *vf_local;
  
  if (vf->seekable == 0) {
    local_2c = 0;
  }
  else {
    local_2c = vf->current_link;
  }
  if (vf->ready_state < 2) {
    vf_local = (OggVorbis_File *)0xffffffffffffff7d;
  }
  else if ((vf->samptrack != 0.0) || (NAN(vf->samptrack))) {
    vf_local = (OggVorbis_File *)
               (long)((vf->bittrack / vf->samptrack) * (double)vf->vi[local_2c].rate + 0.5);
    vf->bittrack = 0.0;
    vf->samptrack = 0.0;
  }
  else {
    vf_local = (OggVorbis_File *)0xffffffffffffffff;
  }
  return (long)vf_local;
}

Assistant:

long ov_bitrate_instant(OggVorbis_File *vf){
  int link=(vf->seekable?vf->current_link:0);
  long ret;
  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(vf->samptrack==0)return(OV_FALSE);
  ret=vf->bittrack/vf->samptrack*vf->vi[link].rate+.5;
  vf->bittrack=0.f;
  vf->samptrack=0.f;
  return(ret);
}